

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O0

bool __thiscall yamc::fair::mutex::try_lock(mutex *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  mutex *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx_);
  bVar1 = this->next_ == this->curr_;
  if (bVar1) {
    this->next_ = this->next_ + 1;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return bVar1;
}

Assistant:

bool try_lock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (next_ != curr_)
      return false;
    ++next_;
    return true;
  }